

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O2

size_t __thiscall spdlog::details::file_helper::size(file_helper *this)

{
  size_t sVar1;
  spdlog_ex *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->fd_ != (FILE *)0x0) {
    sVar1 = os::filesize(this->fd_);
    return sVar1;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&bStack_58,(string *)&this->_filename);
  std::operator+(&local_38,"Cannot use size() on closed file ",&bStack_58);
  spdlog_ex::spdlog_ex(this_00,&local_38);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

size_t size() const
    {
        if (fd_ == nullptr)
        {
            throw spdlog_ex("Cannot use size() on closed file " + os::filename_to_str(_filename));
        }
        return os::filesize(fd_);
    }